

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GLOB *pRVar4;
  REF_INT *pRVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  REF_INT *node_part;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  REF_STATUS RVar12;
  ulong uVar13;
  char *pcVar14;
  REF_INT max_age;
  REF_INT age;
  int local_5c;
  void *local_58;
  REF_MPI local_50;
  uint local_48;
  uint local_44;
  REF_NODE local_40;
  int local_34;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar7 = ref_node_synchronize_globals(ref_node);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6cd
           ,"ref_migrate_to_balance",(ulong)uVar7,"sync global nodes");
    return uVar7;
  }
  uVar7 = ref_node_collect_ghost_age(ref_node);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6ce
           ,"ref_migrate_to_balance",(ulong)uVar7,"collect ghost age");
    return uVar7;
  }
  if (ref_grid->partitioner_full == 0) {
    local_5c = 0;
    if (0 < ref_node->max) {
      iVar8 = 0;
      lVar9 = 0;
      do {
        if ((-1 < ref_node->global[lVar9]) &&
           (iVar2 = ref_node->age[lVar9], local_5c = iVar8, iVar8 <= iVar2)) {
          iVar8 = iVar2;
          local_5c = iVar2;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_node->max);
    }
    local_34 = local_5c;
    uVar7 = ref_mpi_max(ref_mpi,&local_34,&local_5c,1);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x6d8,"ref_migrate_to_balance",(ulong)uVar7,"mpi max");
      return uVar7;
    }
    uVar7 = ref_mpi_bcast(ref_mpi,&local_5c,1,1);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x6d9,"ref_migrate_to_balance",(ulong)uVar7,"min");
      return uVar7;
    }
    uVar13 = 1000;
    if (1000 < local_5c * 10) {
      uVar13 = (ulong)(uint)(local_5c * 10);
    }
    uVar7 = (uint)(ref_node->old_n_global / (long)uVar13);
    local_44 = 1;
    if (1 < (int)uVar7) {
      local_44 = uVar7;
    }
    if (ref_mpi->n < (int)local_44) {
      local_44 = ref_mpi->n;
    }
  }
  else {
    local_44 = ref_mpi->n;
  }
  if ((long)ref_node->max < 0) {
    RVar12 = 1;
    pcVar14 = "malloc node_part of REF_INT negative";
LAB_00222053:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6e0
           ,"ref_migrate_to_balance",pcVar14);
    node_part = (REF_INT *)0x0;
  }
  else {
    node_part = (REF_INT *)malloc((long)ref_node->max << 2);
    if (node_part == (REF_INT *)0x0) {
      RVar12 = 2;
      pcVar14 = "malloc node_part of REF_INT NULL";
      goto LAB_00222053;
    }
    bVar6 = true;
    RVar12 = 0;
    if (0 < ref_node->max) {
      lVar9 = 0;
      do {
        node_part[lVar9] = -1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_node->max);
    }
  }
  if (!bVar6) {
    return RVar12;
  }
  if (((int)local_44 < 2) || (ref_grid->mpi->n < 2)) {
    ref_migrate_single_part(ref_grid,node_part);
  }
  else {
    switch(ref_grid->partitioner) {
    case REF_MIGRATE_RECOMMENDED:
    case REF_MIGRATE_PARMETIS:
    case REF_MIGRATE_ZOLTAN_GRAPH:
    case REF_MIGRATE_ZOLTAN_RCB:
      uVar7 = ref_migrate_native_rcb_part(ref_grid,local_44,node_part);
      if (uVar7 == 0) break;
      uVar13 = (ulong)uVar7;
      pcVar14 = "single by method";
      uVar11 = 0x551;
      goto LAB_00222414;
    case REF_MIGRATE_SINGLE:
      ref_migrate_single_part(ref_grid,node_part);
      break;
    case REF_MIGRATE_NATIVE_RCB:
      uVar7 = ref_migrate_native_rcb_part(ref_grid,local_44,node_part);
      if (uVar7 != 0) {
        uVar13 = (ulong)uVar7;
        pcVar14 = "single by method";
        uVar11 = 0x537;
        goto LAB_00222414;
      }
      break;
    default:
      if (ref_grid->mpi->id == 0) {
        printf("requested partitioner method %d is not recognized or configured\n");
      }
      pcVar14 = "ref_migrate_method";
      uVar7 = 6;
      uVar11 = 0x55b;
      uVar13 = 6;
      goto LAB_00222417;
    }
    local_50 = ref_grid->mpi;
    local_40 = ref_grid->node;
    iVar8 = local_50->n;
    uVar13 = (ulong)iVar8;
    if ((long)uVar13 < 0) {
      uVar13 = 1;
      pcVar14 = "malloc partition_size of REF_INT negative";
LAB_00222208:
      local_58 = (void *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x112,"ref_migrate_report_load_balance",pcVar14);
      bVar6 = false;
    }
    else {
      local_58 = malloc(uVar13 * 4);
      if (local_58 == (void *)0x0) {
        uVar13 = 2;
        pcVar14 = "malloc partition_size of REF_INT NULL";
        goto LAB_00222208;
      }
      bVar6 = true;
      if (iVar8 != 0) {
        lVar9 = 0;
        do {
          *(undefined4 *)((long)local_58 + lVar9 * 4) = 0;
          lVar9 = lVar9 + 1;
          bVar6 = true;
        } while (lVar9 < local_50->n);
      }
    }
    if (bVar6) {
      local_48 = (uint)uVar13;
      if (0 < local_40->max) {
        pRVar4 = local_40->global;
        uVar13 = 0;
        do {
          if ((-1 < pRVar4[uVar13]) && (local_40->ref_mpi->id == local_40->part[uVar13])) {
            iVar8 = node_part[uVar13];
            if (((long)iVar8 < 0) || (local_50->n <= iVar8)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x11a,"ref_migrate_report_load_balance","part out of range");
              printf("rank %d node %d node_part %d n %d",(ulong)(uint)local_50->id,
                     uVar13 & 0xffffffff,(ulong)(uint)node_part[uVar13],(ulong)(uint)local_50->n);
              uVar13 = 1;
              goto LAB_002223ea;
            }
            piVar1 = (int *)((long)local_58 + (long)iVar8 * 4);
            *piVar1 = *piVar1 + 1;
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)local_40->max);
      }
      uVar7 = ref_mpi_allsum(local_50,local_58,local_50->n,1);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x11f,"ref_migrate_report_load_balance",(ulong)uVar7);
        local_48 = uVar7;
      }
      uVar13 = (ulong)local_48;
      if (uVar7 == 0) {
        if ((int)local_44 < 1) {
          uVar7 = 0;
          uVar13 = 0x7fffffff;
        }
        else {
          uVar13 = 0x7fffffff;
          uVar10 = 0;
          uVar7 = 0;
          do {
            uVar3 = *(uint *)((long)local_58 + uVar10 * 4);
            if ((int)uVar3 <= (int)uVar13) {
              uVar13 = (ulong)uVar3;
            }
            if ((int)uVar7 <= (int)uVar3) {
              uVar7 = uVar3;
            }
            uVar10 = uVar10 + 1;
          } while (local_44 != uVar10);
        }
        if (local_50->id == 0) {
          printf("balance %6.3f on %d of %d target %d size min %d max %d\n",
                 (double)(int)local_44 * ((double)(int)uVar7 / (double)local_40->old_n_global),
                 (ulong)local_44,(ulong)(uint)local_50->n,
                 local_40->old_n_global / (long)(ulong)local_44 & 0xffffffff,uVar13);
        }
        uVar13 = 0;
        if (local_58 != (void *)0x0) {
          free(local_58);
        }
      }
    }
LAB_002223ea:
    if ((int)uVar13 != 0) {
      pcVar14 = "report bal";
      uVar11 = 0x55f;
LAB_00222414:
      uVar7 = (uint)uVar13;
      uVar13 = uVar13 & 0xffffffff;
LAB_00222417:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar11,"ref_migrate_new_part",uVar13,pcVar14);
      goto LAB_0022241e;
    }
  }
  uVar7 = 0;
LAB_0022241e:
  if (uVar7 == 0) {
    uVar7 = ref_node_ghost_int(ref_node,node_part,1);
    if (uVar7 == 0) {
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"migrate: new part");
      }
      if (ref_grid->interp == (REF_INTERP)0x0) {
        if (0 < ref_node->max) {
          pRVar5 = ref_node->part;
          lVar9 = 0;
          do {
            pRVar5[lVar9] = node_part[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 < ref_node->max);
        }
        uVar7 = ref_migrate_shufflin(ref_grid);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x6ef,"ref_migrate_to_balance",(ulong)uVar7,"shufflin");
          return uVar7;
        }
        pcVar14 = "shuffle primal";
      }
      else {
        uVar7 = ref_interp_from_part(ref_grid->interp,node_part);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x6e9,"ref_migrate_to_balance",(ulong)uVar7,"from part");
          return uVar7;
        }
        pcVar14 = "shuffle primal back";
      }
      ref_mpi_stopwatch_stop(ref_grid->mpi,pcVar14);
      uVar7 = 0;
      if (node_part != (REF_INT *)0x0) {
        free(node_part);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x6e3,"ref_migrate_to_balance",(ulong)uVar7,"ghost part");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6e2
           ,"ref_migrate_to_balance",(ulong)uVar7,"new part");
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT npart;
  REF_INT node, age, max_age;
  REF_INT node_per_core, heuristic;
  REF_INT *node_part;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");
  RSS(ref_node_collect_ghost_age(ref_node), "collect ghost age");
  if (ref_grid_partitioner_full(ref_grid)) {
    npart = ref_mpi_n(ref_mpi);
  } else {
    /* heuristic to reduce the number of active cores when over decomposed */
    max_age = 0;
    each_ref_node_valid_node(ref_node, node) {
      max_age = MAX(max_age, ref_node_age(ref_node, node));
    }
    age = max_age;
    RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");
    node_per_core = MAX(1000, 10 * max_age);
    heuristic = MAX(
        1, (REF_INT)(ref_node_n_global(ref_node) / (REF_GLOB)node_per_core));
    npart = MIN(ref_mpi_n(ref_mpi), heuristic);
  }

  ref_malloc_init(node_part, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  RSS(ref_migrate_new_part(ref_grid, npart, node_part), "new part");
  RSS(ref_node_ghost_int(ref_node, node_part, 1), "ghost part");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "migrate: new part");

  if (NULL != ref_grid_interp(ref_grid)) {
    RSS(ref_interp_from_part(ref_grid_interp(ref_grid), node_part),
        "from part");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal back");
  } else {
    for (node = 0; node < ref_node_max(ref_node); node++)
      ref_node_part(ref_node, node) = node_part[node];

    RSS(ref_migrate_shufflin(ref_grid), "shufflin");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal");
  }
  ref_free(node_part);

  return REF_SUCCESS;
}